

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_SHC(TT_ExecContext exc,FT_Long *args)

{
  ushort uVar1;
  FT_Bool FVar2;
  ushort uVar3;
  ushort local_7a;
  ushort local_78;
  ushort local_76;
  FT_UShort i;
  FT_UShort limit;
  FT_UShort start;
  FT_Short bounds;
  FT_Short contour;
  FT_F26Dot6 dy;
  FT_F26Dot6 dx;
  undefined1 local_58 [6];
  FT_UShort refp;
  TT_GlyphZoneRec zp;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar3 = (ushort)*args;
  if ((exc->GS).gep2 == 0) {
    uVar1 = 1;
  }
  else {
    uVar1 = (exc->zp2).n_contours;
  }
  if (uVar3 < uVar1) {
    zp._56_8_ = args;
    FVar2 = Compute_Point_Displacement
                      (exc,&dy,(FT_F26Dot6 *)&limit,(TT_GlyphZone)local_58,
                       (FT_UShort *)((long)&dx + 6));
    if (FVar2 == '\0') {
      if (uVar3 == 0) {
        local_76 = 0;
      }
      else {
        local_76 = ((exc->zp2).contours[(short)uVar3 + -1] + 1) - (exc->zp2).first_point;
      }
      if ((exc->GS).gep2 == 0) {
        local_78 = (exc->zp2).n_points;
      }
      else {
        local_78 = ((exc->zp2).contours[(short)uVar3] - (exc->zp2).first_point) + 1;
      }
      for (local_7a = local_76; local_7a < local_78; local_7a = local_7a + 1) {
        if ((zp.org != (exc->zp2).cur) || (dx._6_2_ != local_7a)) {
          Move_Zp2_Point(exc,local_7a,dy,_limit,'\x01');
        }
      }
    }
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  return;
}

Assistant:

static void
  Ins_SHC( TT_ExecContext  exc,
           FT_Long*        args )
  {
    TT_GlyphZoneRec  zp;
    FT_UShort        refp;
    FT_F26Dot6       dx, dy;

    FT_Short         contour, bounds;
    FT_UShort        start, limit, i;


    contour = (FT_Short)args[0];
    bounds  = ( exc->GS.gep2 == 0 ) ? 1 : exc->zp2.n_contours;

    if ( BOUNDS( contour, bounds ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      return;
    }

    if ( Compute_Point_Displacement( exc, &dx, &dy, &zp, &refp ) )
      return;

    if ( contour == 0 )
      start = 0;
    else
      start = (FT_UShort)( exc->zp2.contours[contour - 1] + 1 -
                           exc->zp2.first_point );

    /* we use the number of points if in the twilight zone */
    if ( exc->GS.gep2 == 0 )
      limit = exc->zp2.n_points;
    else
      limit = (FT_UShort)( exc->zp2.contours[contour] -
                           exc->zp2.first_point + 1 );

    for ( i = start; i < limit; i++ )
    {
      if ( zp.cur != exc->zp2.cur || refp != i )
        Move_Zp2_Point( exc, i, dx, dy, TRUE );
    }
  }